

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::consume_operation::commit(consume_operation *this)

{
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *this_00;
  void *i_dest;
  
  if ((this->m_consume_data).m_next_ptr < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x3a7);
  }
  this_00 = complete_type(this);
  i_dest = element_ptr(this);
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  ::destroy(this_00,i_dest);
  LOCK();
  ((this->m_consume_data).m_control)->m_next = (this->m_consume_data).m_next_ptr;
  UNLOCK();
  detail::
  LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::Consume::clean_dead_elements(&this->m_consume_data);
  (this->m_consume_data).m_next_ptr = 0;
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());

                auto const & type    = complete_type();
                auto const   element = element_ptr();
                type.destroy(element);

                type.RUNTIME_TYPE::~RUNTIME_TYPE();

                m_consume_data.commit_consume_impl();
            }